

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM_x86_avx::forward
          (LSTM_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  _func_int *p_Var6;
  int iVar7;
  pointer pMVar8;
  size_t sVar9;
  void *pvVar10;
  void *__dest;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  Mat m;
  Mat local_388;
  Mat local_338;
  pointer local_2e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2e0;
  Mat m_3;
  Mat m_7;
  Mat m_2;
  Mat m_1;
  Mat m_6;
  Mat m_5;
  Mat m_4;
  Mat m_11;
  Mat m_10;
  
  local_2e8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  _h = local_2e8->h;
  iVar1 = *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x40 + (long)&(this->weight_hc_data_packed).data);
  local_338.cstep = 0;
  local_338.data = (void *)0x0;
  local_338.refcount._0_4_ = 0;
  local_338.refcount._4_4_ = 0;
  local_338.elemsize._0_4_ = 0;
  local_338.elemsize._4_4_ = 0;
  local_338.elempack = 0;
  local_338.allocator = (Allocator *)0x0;
  local_338.dims = 0;
  local_338.w = 0;
  local_338.h = 0;
  local_338.d = 0;
  local_338.c = 0;
  local_388.cstep = 0;
  local_388.data = (void *)0x0;
  local_388.refcount._0_4_ = 0;
  local_388.refcount._4_4_ = 0;
  local_388.elemsize._0_4_ = 0;
  local_388.elemsize._4_4_ = 0;
  local_388.elempack = 0;
  local_388.allocator = (Allocator *)0x0;
  local_388.dims = 0;
  local_388.w = 0;
  local_388.h = 0;
  local_388.d = 0;
  local_388.c = 0;
  pvVar10 = (void *)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start);
  _allocator = (&opt->blob_allocator)[pvVar10 != (void *)0xd8];
  iVar3 = -100;
  local_2e0 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)local_2e8 == 0xd8) {
    Mat::clone(&m,(__fn *)(local_2e8 + 1),_allocator,(int)opt,pvVar10);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_338.allocator == (Allocator *)0x0) {
          free(local_338.data);
        }
        else {
          (*(local_338.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_338.data = m.data;
    local_338.refcount._0_4_ = m.refcount._0_4_;
    local_338.refcount._4_4_ = m.refcount._4_4_;
    local_338.elemsize._0_4_ = (undefined4)m.elemsize;
    local_338.elemsize._4_4_ = m.elemsize._4_4_;
    local_338.elempack = m.elempack;
    local_338.allocator = m.allocator;
    local_338.dims = m.dims;
    local_338.w = m.w;
    local_338.h = m.h;
    local_338.d = m.d;
    local_338.c = m.c;
    local_338.cstep = m.cstep;
    sVar9 = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar9,
               pvVar10);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_388.allocator == (Allocator *)0x0) {
          free(local_388.data);
        }
        else {
          (*(local_388.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_388.data = m.data;
    local_388.refcount._0_4_ = m.refcount._0_4_;
    local_388.refcount._4_4_ = m.refcount._4_4_;
    local_388.elemsize._0_4_ = (undefined4)m.elemsize;
    local_388.elemsize._4_4_ = m.elemsize._4_4_;
    local_388.elempack = m.elempack;
    local_388.allocator = m.allocator;
    local_388.dims = m.dims;
    local_388.w = m.w;
    local_388.h = m.h;
    local_388.d = m.d;
    local_388.c = m.c;
    local_388.cstep = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    iVar7 = (iVar1 == 2) + 1;
    Mat::create(&local_338,
                *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                        (long)&(this->weight_hc_data_packed).data),iVar7,4,_allocator);
    if ((local_338.data == (void *)0x0) || (local_338.cstep * (long)local_338.c == 0))
    goto LAB_0033c454;
    uVar4 = (int)local_338.cstep * local_338.c;
    uVar11 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar11;
    }
    for (; (int)uVar5 != (int)uVar11; uVar11 = uVar11 + 1) {
      *(undefined4 *)((long)local_338.data + uVar11 * 4) = 0;
    }
    Mat::create(&local_388,
                *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x44 +
                        (long)&(this->weight_hc_data_packed).data),iVar7,4,_allocator);
    if ((local_388.data == (void *)0x0) || (local_388.cstep * (long)local_388.c == 0))
    goto LAB_0033c454;
    uVar4 = (int)local_388.cstep * local_388.c;
    uVar11 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar11;
    }
    for (; (int)uVar5 != (int)uVar11; uVar11 = uVar11 + 1) {
      *(undefined4 *)((long)local_388.data + uVar11 * 4) = 0;
    }
  }
  this_00 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                              (long)&(this->weight_hc_data_packed).data) << (iVar1 == 2),_h,4,
              opt->blob_allocator);
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var6 = this->_vptr_LSTM_x86_avx[-3];
    uVar4 = *(uint *)(p_Var6 + 0x40 + (long)&(this->weight_hc_data_packed).data);
    if (uVar4 < 2) {
      m.w = (this->weight_xc_data_packed).w;
      m.h = (this->weight_xc_data_packed).h;
      m.c = (this->weight_xc_data_packed).d;
      m.data = (this->weight_xc_data_packed).data;
      uVar5 = (this->weight_xc_data_packed).elemsize;
      m.elempack = (this->weight_xc_data_packed).elempack;
      m.allocator = (this->weight_xc_data_packed).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar5;
      m.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
      m.d = 1;
      iVar1 = (this->weight_xc_data_packed).dims;
      m.dims = iVar1 + -1;
      m.cstep = (uVar5 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar5;
      if (iVar1 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data_packed).w;
      m_1.h = (this->bias_c_data_packed).h;
      m_1.data = (this->bias_c_data_packed).data;
      uVar5 = (this->bias_c_data_packed).elemsize;
      m_1.elempack = (this->bias_c_data_packed).elempack;
      m_1.allocator = (this->bias_c_data_packed).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar5;
      m_1.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
      m_1.c = (this->bias_c_data_packed).d;
      m_1.d = 1;
      iVar1 = (this->bias_c_data_packed).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar5 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar5;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data_packed).w;
      m_2.h = (this->weight_hc_data_packed).h;
      m_2.c = (this->weight_hc_data_packed).d;
      m_2.data = (this->weight_hc_data_packed).data;
      m_2.elemsize = (this->weight_hc_data_packed).elemsize;
      m_2.elempack = (this->weight_hc_data_packed).elempack;
      m_2.allocator = (this->weight_hc_data_packed).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar9 = (long)m_2.h * (long)m_2.w;
      iVar1 = (this->weight_hc_data_packed).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (m_2.elemsize * sVar9 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar1 == 4) {
        m_2.cstep = sVar9;
      }
      if (*(int *)(p_Var6 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
          *(int *)(p_Var6 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = *(int *)(&this->field_0x1e4 + (long)p_Var6);
        m_3.h = *(int *)(&this->field_0x1e8 + (long)p_Var6);
        m_3.c = *(int *)(&this->field_0x1ec + (long)p_Var6);
        m_3.data = *(void **)(&this->field_0x1b8 + (long)p_Var6);
        uVar5 = *(ulong *)(&this->field_0x1c8 + (long)p_Var6);
        m_3.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var6);
        m_3.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var6);
        m_3.elemsize._0_4_ = (undefined4)uVar5;
        m_3.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
        m_3.d = 1;
        m_3.dims = *(int *)(&this->field_0x1e0 + (long)p_Var6) + -1;
        m_3.cstep = (uVar5 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar5;
        if (*(int *)(&this->field_0x1e0 + (long)p_Var6) == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar3 = lstm(local_2e8,this_00,uVar4,&m,&m_1,&m_2,&m_3,&local_338,&local_388,opt);
      if (iVar3 != 0) goto LAB_0033c454;
      p_Var6 = this->_vptr_LSTM_x86_avx[-3];
      uVar4 = *(uint *)(p_Var6 + 0x40 + (long)&(this->weight_hc_data_packed).data);
    }
    if (uVar4 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,*(int *)(p_Var6 + 0x38 + (long)&(this->weight_hc_data_packed).data),_h,4,
                  opt->workspace_allocator);
      iVar3 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar13 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                 (long)&(this->weight_hc_data_packed).data),_h,4,
                    opt->workspace_allocator);
        iVar3 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar13 = false;
        }
        else {
          m_2.cstep = (size_t)local_338.w;
          m_2.elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
          m_2.data = local_338.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_338.elempack;
          m_2.allocator = local_338.allocator;
          iVar12 = 2;
          m_2.w = local_338.w;
          m_2.h = 1;
          m_2.d = 1;
          iVar7 = 1;
          m_3.cstep = (size_t)local_388.w;
          m_3.data = local_388.data;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_388.elemsize;
          m_3.elemsize._4_4_ = local_388.elemsize._4_4_;
          m_3.elempack = local_388.elempack;
          m_3.allocator = local_388.allocator;
          m_3.w = local_388.w;
          m_3.h = 1;
          m_3.d = 1;
          m_4.w = (this->weight_xc_data_packed).w;
          m_4.h = (this->weight_xc_data_packed).h;
          m_4.c = (this->weight_xc_data_packed).d;
          m_4.data = (this->weight_xc_data_packed).data;
          m_4.elemsize = (this->weight_xc_data_packed).elemsize;
          m_4.elempack = (this->weight_xc_data_packed).elempack;
          m_4.allocator = (this->weight_xc_data_packed).allocator;
          m_4.refcount = (int *)0x0;
          m_4.d = 1;
          sVar9 = (long)m_4.h * (long)m_4.w;
          iVar1 = (this->weight_xc_data_packed).dims;
          m_4.dims = iVar1 + -1;
          m_4.cstep = (m_4.elemsize * sVar9 + 0xf & 0xfffffffffffffff0) / m_4.elemsize;
          if (iVar1 == 4) {
            m_4.cstep = sVar9;
          }
          m_5.w = (this->bias_c_data_packed).w;
          m_5.h = (this->bias_c_data_packed).h;
          m_5.c = (this->bias_c_data_packed).d;
          m_5.data = (this->bias_c_data_packed).data;
          m_5.elemsize = (this->bias_c_data_packed).elemsize;
          m_5.elempack = (this->bias_c_data_packed).elempack;
          m_5.allocator = (this->bias_c_data_packed).allocator;
          m_5.refcount = (int *)0x0;
          m_5.d = 1;
          sVar9 = (long)m_5.h * (long)m_5.w;
          iVar1 = (this->bias_c_data_packed).dims;
          m_5.dims = iVar1 + -1;
          m_5.cstep = (m_5.elemsize * sVar9 + 0xf & 0xfffffffffffffff0) / m_5.elemsize;
          if (iVar1 == 4) {
            m_5.cstep = sVar9;
          }
          m_6.w = (this->weight_hc_data_packed).w;
          m_6.h = (this->weight_hc_data_packed).h;
          m_6.c = (this->weight_hc_data_packed).d;
          m_6.data = (this->weight_hc_data_packed).data;
          m_6.elemsize = (this->weight_hc_data_packed).elemsize;
          m_6.elempack = (this->weight_hc_data_packed).elempack;
          m_6.allocator = (this->weight_hc_data_packed).allocator;
          m_6.refcount = (int *)0x0;
          m_6.d = 1;
          iVar1 = (this->weight_hc_data_packed).dims;
          m_6.dims = iVar1 + -1;
          m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                      m_6.elemsize;
          if (iVar1 == 4) {
            m_6.cstep = (long)m_6.h * (long)m_6.w;
          }
          p_Var6 = this->_vptr_LSTM_x86_avx[-3];
          if (*(int *)(p_Var6 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
              *(int *)(p_Var6 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
            m_7.cstep = 0;
            m_7.data = (void *)0x0;
            m_7.elemsize._0_4_ = 0;
            m_7.elemsize._4_4_ = 0;
            m_7.elempack = 0;
            m_7.allocator = (Allocator *)0x0;
            m_7.dims = 0;
            m_7.w = 0;
            m_7.h = 0;
            m_7.d = 0;
            m_7.c = 0;
          }
          else {
            m_7.w = *(int *)(&this->field_0x1e4 + (long)p_Var6);
            m_7.h = *(int *)(&this->field_0x1e8 + (long)p_Var6);
            m_7.data = *(void **)(&this->field_0x1b8 + (long)p_Var6);
            uVar5 = *(ulong *)(&this->field_0x1c8 + (long)p_Var6);
            m_7.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var6);
            m_7.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var6);
            m_7.elemsize._0_4_ = (undefined4)uVar5;
            m_7.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m_7.c = *(int *)(&this->field_0x1ec + (long)p_Var6);
            m_7.d = 1;
            m_7.dims = *(int *)(&this->field_0x1e0 + (long)p_Var6) + -1;
            m_7.cstep = (uVar5 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (*(int *)(&this->field_0x1e0 + (long)p_Var6) == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
          }
          m_7.refcount._4_4_ = 0;
          m_7.refcount._0_4_ = 0;
          m_3.dims = iVar12;
          m_3.c = iVar7;
          m_2.dims = iVar12;
          m_2.c = iVar7;
          iVar3 = lstm(local_2e8,&m,0,&m_4,&m_5,&m_6,&m_7,&m_2,&m_3,opt);
          if (iVar3 == 0) {
            m_4.cstep = (size_t)local_338.w;
            m_4.elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
            m_4.data = (void *)(m_4.elemsize * m_4.cstep + (long)local_338.data);
            m_4.refcount = (int *)0x0;
            m_4.elempack = local_338.elempack;
            m_4.allocator = local_338.allocator;
            m_4.w = local_338.w;
            m_4.h = 1;
            m_4.d = 1;
            m_5.cstep = (size_t)local_388.w;
            m_5.elemsize = CONCAT44(local_388.elemsize._4_4_,(undefined4)local_388.elemsize);
            m_5.data = (void *)(m_5.elemsize * m_5.cstep + (long)local_388.data);
            m_5.refcount = (int *)0x0;
            m_5.elempack = local_388.elempack;
            m_5.allocator = local_388.allocator;
            m_5.w = local_388.w;
            m_5.h = 1;
            m_5.d = 1;
            m_6.w = (this->weight_xc_data_packed).w;
            m_6.h = (this->weight_xc_data_packed).h;
            m_6.elemsize = (this->weight_xc_data_packed).elemsize;
            m_6.data = (void *)((this->weight_xc_data_packed).cstep * m_6.elemsize +
                               (long)(this->weight_xc_data_packed).data);
            m_6.c = (this->weight_xc_data_packed).d;
            m_6.elempack = (this->weight_xc_data_packed).elempack;
            m_6.allocator = (this->weight_xc_data_packed).allocator;
            m_6.refcount = (int *)0x0;
            iVar1 = (this->weight_xc_data_packed).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                        m_6.elemsize;
            if (iVar1 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            m_7.w = (this->bias_c_data_packed).w;
            m_7.h = (this->bias_c_data_packed).h;
            uVar5 = (this->bias_c_data_packed).elemsize;
            m_7.data = (void *)((this->bias_c_data_packed).cstep * uVar5 +
                               (long)(this->bias_c_data_packed).data);
            m_7.elempack = (this->bias_c_data_packed).elempack;
            m_7.allocator = (this->bias_c_data_packed).allocator;
            m_7.refcount._0_4_ = 0;
            m_7.refcount._4_4_ = 0;
            m_7.elemsize._0_4_ = (undefined4)uVar5;
            m_7.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            m_7.c = (this->bias_c_data_packed).d;
            m_7.d = 1;
            iVar1 = (this->bias_c_data_packed).dims;
            m_7.dims = iVar1 + -1;
            m_7.cstep = (uVar5 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar5;
            if (iVar1 == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
            m_10.w = (this->weight_hc_data_packed).w;
            m_10.h = (this->weight_hc_data_packed).h;
            m_10.elemsize = (this->weight_hc_data_packed).elemsize;
            m_10.data = (void *)((this->weight_hc_data_packed).cstep * m_10.elemsize +
                                (long)(this->weight_hc_data_packed).data);
            m_10.c = (this->weight_hc_data_packed).d;
            m_10.elempack = (this->weight_hc_data_packed).elempack;
            m_10.allocator = (this->weight_hc_data_packed).allocator;
            m_10.refcount = (int *)0x0;
            m_10.d = 1;
            iVar1 = (this->weight_hc_data_packed).dims;
            m_10.dims = iVar1 + -1;
            m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                         m_10.elemsize;
            if (iVar1 == 4) {
              m_10.cstep = (long)m_10.h * (long)m_10.w;
            }
            p_Var6 = this->_vptr_LSTM_x86_avx[-3];
            if (*(int *)(p_Var6 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
                *(int *)(p_Var6 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
              m_11.cstep = 0;
              m_11.data = (void *)0x0;
              m_11.elemsize._0_4_ = 0;
              m_11.elemsize._4_4_ = 0;
              m_11.elempack = 0;
              m_11.allocator = (Allocator *)0x0;
              m_11.dims = 0;
              m_11.w = 0;
              m_11.h = 0;
              m_11.d = 0;
              m_11.c = 0;
            }
            else {
              m_11.w = *(int *)(&this->field_0x1e4 + (long)p_Var6);
              m_11.h = *(int *)(&this->field_0x1e8 + (long)p_Var6);
              uVar5 = *(ulong *)(&this->field_0x1c8 + (long)p_Var6);
              m_11.data = (void *)(*(long *)(&this->field_0x1f8 + (long)p_Var6) * uVar5 +
                                  *(long *)(&this->field_0x1b8 + (long)p_Var6));
              m_11.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var6);
              m_11.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var6);
              m_11.elemsize._0_4_ = (undefined4)uVar5;
              m_11.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
              m_11.c = *(int *)(&this->field_0x1ec + (long)p_Var6);
              m_11.d = 1;
              m_11.dims = *(int *)(&this->field_0x1e0 + (long)p_Var6) + -1;
              m_11.cstep = (uVar5 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar5;
              if (*(int *)(&this->field_0x1e0 + (long)p_Var6) == 4) {
                m_11.cstep = (long)m_11.h * (long)m_11.w;
              }
            }
            m_11.refcount._4_4_ = 0;
            m_11.refcount._0_4_ = 0;
            m_6.d = iVar7;
            m_5.dims = iVar12;
            m_5.c = iVar7;
            m_4.dims = iVar12;
            m_4.c = iVar7;
            iVar3 = lstm(local_2e8,&m_1,1,&m_6,&m_7,&m_10,&m_11,&m_4,&m_5,opt);
            bVar13 = iVar3 == 0;
            if (bVar13) {
              uVar5 = (ulong)_h;
              if ((int)_h < 1) {
                uVar5 = 0;
              }
              for (uVar11 = 0; iVar3 = 0, uVar5 != uVar11; uVar11 = uVar11 + 1) {
                pvVar10 = (void *)((long)m_1.w * uVar11 *
                                   CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                  (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar11 * this_00->elemsize +
                                 (long)this_00->data);
                memcpy(__dest,(void *)((long)m.w * uVar11 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),
                       (long)*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                     (long)&(this->weight_hc_data_packed).data) << 2);
                memcpy((void *)((long)__dest +
                               (long)*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                             (long)&(this->weight_hc_data_packed).data) * 4),pvVar10
                       ,(long)*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                      (long)&(this->weight_hc_data_packed).data) << 2);
              }
            }
            piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar13 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                free(m_2.data);
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar13) goto LAB_0033c454;
    }
    pMVar8 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = 0;
    if ((long)(local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar8 == 0xd8) {
      if (pMVar8 + 1 != &local_338) {
        piVar2 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar8[1].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar8[1].allocator == (Allocator *)0x0) {
              free(pMVar8[1].data);
            }
            else {
              (*(pMVar8[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[1].data = local_338.data;
        pMVar8[1].refcount = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
        pMVar8[1].elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
        pMVar8[1].elempack = local_338.elempack;
        pMVar8[1].allocator = local_338.allocator;
        pMVar8[1].dims = local_338.dims;
        pMVar8[1].w = local_338.w;
        pMVar8[1].h = local_338.h;
        pMVar8[1].d = local_338.d;
        pMVar8[1].c = local_338.c;
        pMVar8[1].cstep = local_338.cstep;
        pMVar8 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (pMVar8 + 2 != &local_388) {
        piVar2 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar8[2].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar8[2].allocator == (Allocator *)0x0) {
              free(pMVar8[2].data);
            }
            else {
              (*(pMVar8[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[2].data = local_388.data;
        pMVar8[2].refcount = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
        pMVar8[2].elemsize = CONCAT44(local_388.elemsize._4_4_,(undefined4)local_388.elemsize);
        pMVar8[2].elempack = local_388.elempack;
        pMVar8[2].allocator = local_388.allocator;
        pMVar8[2].dims = local_388.dims;
        pMVar8[2].w = local_388.w;
        pMVar8[2].h = local_388.h;
        pMVar8[2].d = local_388.d;
        pMVar8[2].c = local_388.c;
        pMVar8[2].cstep = local_388.cstep;
      }
    }
  }
LAB_0033c454:
  piVar2 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_388.allocator == (Allocator *)0x0) {
        free(local_388.data);
      }
      else {
        (*(local_388.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_338.allocator == (Allocator *)0x0) {
        free(local_338.data);
      }
      else {
        (*(local_338.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar3;
}

Assistant:

int LSTM_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data_packed.channel(1), bias_c_data_packed.channel(1), weight_hc_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}